

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

int nghttp2_session_on_altsvc_received(nghttp2_session *session,nghttp2_frame *frame)

{
  size_t sVar1;
  long lVar2;
  nghttp2_on_frame_recv_callback p_Var3;
  nghttp2_on_invalid_frame_recv_callback p_Var4;
  int iVar5;
  void *pvVar6;
  
  sVar1 = (frame->data).padlen;
  lVar2 = *(long *)(sVar1 + 8);
  if ((frame->hd).stream_id == 0) {
    if (lVar2 != 0) goto LAB_00524c97;
  }
  else if (lVar2 == 0) {
    pvVar6 = nghttp2_map_find(&session->streams,(frame->hd).stream_id);
    if (pvVar6 == (void *)0x0) {
      return 0;
    }
    if ((*(byte *)((long)pvVar6 + 0xd8) & 2) != 0) {
      return 0;
    }
    if (*(int *)((long)pvVar6 + 0xcc) == 3) {
      return 0;
    }
    if (*(int *)((long)pvVar6 + 0xcc) == 5) {
      return 0;
    }
LAB_00524c97:
    if (*(long *)(sVar1 + 0x18) != 0) {
      p_Var3 = (session->callbacks).on_frame_recv_callback;
      if (p_Var3 == (nghttp2_on_frame_recv_callback)0x0) {
        return 0;
      }
      iVar5 = (*p_Var3)(session,frame,session->user_data);
      goto LAB_00524cdb;
    }
  }
  p_Var4 = (session->callbacks).on_invalid_frame_recv_callback;
  if (p_Var4 == (nghttp2_on_invalid_frame_recv_callback)0x0) {
    return 0;
  }
  iVar5 = (*p_Var4)(session,frame,-0x1f9,session->user_data);
LAB_00524cdb:
  if (iVar5 == 0) {
    return 0;
  }
  return -0x386;
}

Assistant:

int nghttp2_session_on_altsvc_received(nghttp2_session *session,
                                       nghttp2_frame *frame) {
  nghttp2_ext_altsvc *altsvc;
  nghttp2_stream *stream;

  altsvc = frame->ext.payload;

  /* session->server case has been excluded */

  if (frame->hd.stream_id == 0) {
    if (altsvc->origin_len == 0) {
      return session_call_on_invalid_frame_recv_callback(session, frame,
                                                         NGHTTP2_ERR_PROTO);
    }
  } else {
    if (altsvc->origin_len > 0) {
      return session_call_on_invalid_frame_recv_callback(session, frame,
                                                         NGHTTP2_ERR_PROTO);
    }

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    if (stream->state == NGHTTP2_STREAM_CLOSING) {
      return 0;
    }
  }

  if (altsvc->field_value_len == 0) {
    return session_call_on_invalid_frame_recv_callback(session, frame,
                                                       NGHTTP2_ERR_PROTO);
  }

  return session_call_on_frame_received(session, frame);
}